

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::ValueExtractor::extractGeometry
          (ValueExtractor *this,int *w,int *h,int *minw,int *minh,int *maxw,int *maxh)

{
  int iVar1;
  QList<QCss::Declaration> *this_00;
  qsizetype qVar2;
  ValueExtractor *this_01;
  DeclarationData *pDVar3;
  int *in_RCX;
  int *in_RDX;
  int *in_RSI;
  QList<QCss::Declaration> *in_RDI;
  int *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  Declaration *decl;
  int i;
  bool hit;
  ulong in_stack_ffffffffffffffa8;
  ValueExtractor *in_stack_ffffffffffffffb0;
  int local_38;
  bool local_31;
  
  extractFont(in_stack_ffffffffffffffb0);
  local_31 = false;
  local_38 = 0;
  do {
    this_00 = (QList<QCss::Declaration> *)(long)local_38;
    qVar2 = QList<QCss::Declaration>::size(in_RDI);
    if (qVar2 <= (long)this_00) {
      return local_31;
    }
    this_01 = (ValueExtractor *)QList<QCss::Declaration>::at(this_00,in_stack_ffffffffffffffa8);
    pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                       ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2dfc9
                       );
    in_stack_ffffffffffffffa8 = (ulong)(pDVar3->propertyId - Width);
    switch(in_stack_ffffffffffffffa8) {
    case 0:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_RSI = iVar1;
      break;
    case 1:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_RDX = iVar1;
      break;
    case 2:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_RCX = iVar1;
      break;
    case 3:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_R8 = iVar1;
      break;
    case 4:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_R9 = iVar1;
      break;
    case 5:
      iVar1 = lengthValue(this_01,(Declaration *)in_RDI);
      *in_stack_00000008 = iVar1;
      break;
    default:
      goto switchD_00a2dff0_default;
    }
    local_31 = true;
switchD_00a2dff0_default:
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

bool ValueExtractor::extractGeometry(int *w, int *h, int *minw, int *minh, int *maxw, int *maxh)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Width: *w = lengthValue(decl); break;
        case Height: *h = lengthValue(decl); break;
        case MinimumWidth: *minw = lengthValue(decl); break;
        case MinimumHeight: *minh = lengthValue(decl); break;
        case MaximumWidth: *maxw = lengthValue(decl); break;
        case MaximumHeight: *maxh = lengthValue(decl); break;
        default: continue;
        }
        hit = true;
    }

    return hit;
}